

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O2

int If_ManCountSpecialPos(If_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  byte *pbVar3;
  int iVar4;
  If_Par_t *pIVar5;
  int iVar6;
  int iVar7;
  
  pIVar5 = p->pPars;
  iVar6 = pIVar5->nLatchesCoBox;
  while( true ) {
    iVar1 = p->nObjs[3];
    iVar4 = pIVar5->nLatchesCo;
    if (iVar1 - iVar4 <= iVar6) break;
    pvVar2 = Vec_PtrEntry(p->vCos,iVar6);
    **(uint **)((long)pvVar2 + 0x18) = **(uint **)((long)pvVar2 + 0x18) & 0xfffffeff;
    iVar6 = iVar6 + 1;
    pIVar5 = p->pPars;
  }
  for (iVar6 = pIVar5->nLatchesCoBox; iVar6 < iVar1 - iVar4; iVar6 = iVar6 + 1) {
    pbVar3 = (byte *)Vec_PtrEntry(p->vCos,iVar6);
    if ((*pbVar3 & 0x10) == 0) {
      **(uint **)(pbVar3 + 0x18) = **(uint **)(pbVar3 + 0x18) | 0x100;
    }
    iVar1 = p->nObjs[3];
    pIVar5 = p->pPars;
    iVar4 = pIVar5->nLatchesCo;
  }
  iVar7 = 0;
  for (iVar6 = pIVar5->nLatchesCoBox; iVar6 < iVar1 - iVar4; iVar6 = iVar6 + 1) {
    pbVar3 = (byte *)Vec_PtrEntry(p->vCos,iVar6);
    if ((*pbVar3 & 0x10) != 0) {
      iVar7 = iVar7 + (uint)((**(uint **)(pbVar3 + 0x18) >> 8 & 1) != 0);
    }
    iVar1 = p->nObjs[3];
    pIVar5 = p->pPars;
    iVar4 = pIVar5->nLatchesCo;
  }
  for (iVar6 = pIVar5->nLatchesCoBox; iVar6 < iVar1 - iVar4; iVar6 = iVar6 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCos,iVar6);
    **(uint **)((long)pvVar2 + 0x18) = **(uint **)((long)pvVar2 + 0x18) & 0xfffffeff;
    iVar1 = p->nObjs[3];
    iVar4 = p->pPars->nLatchesCo;
  }
  return iVar7;
}

Assistant:

int If_ManCountSpecialPos( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i, Counter = 0;
    // clean all marks
    If_ManForEachPo( p, pObj, i )
        If_ObjFanin0(pObj)->fMark = 0;
    // label nodes 
    If_ManForEachPo( p, pObj, i )
        if ( !If_ObjFaninC0(pObj) )
            If_ObjFanin0(pObj)->fMark = 1;
    // label nodes 
    If_ManForEachPo( p, pObj, i )
        if ( If_ObjFaninC0(pObj) )
            Counter += If_ObjFanin0(pObj)->fMark;
    // clean all marks
    If_ManForEachPo( p, pObj, i )
        If_ObjFanin0(pObj)->fMark = 0;
    return Counter;
}